

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMultiphysicsInterfaceEl.h
# Opt level: O1

int __thiscall TPZMultiphysicsInterfaceElement::nmeshes(TPZMultiphysicsInterfaceElement *this)

{
  TPZCompEl *pTVar1;
  int iVar2;
  long *plVar3;
  
  pTVar1 = (this->fLeftElSide).fEl;
  if ((pTVar1 == (TPZCompEl *)0x0) ||
     (plVar3 = (long *)__dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZMultiphysicsElement::typeinfo,
                                      0), plVar3 == (long *)0x0)) {
    pTVar1 = (this->fRightElSide).fEl;
    if ((pTVar1 == (TPZCompEl *)0x0) ||
       (plVar3 = (long *)__dynamic_cast(pTVar1,&TPZCompEl::typeinfo,
                                        &TPZMultiphysicsElement::typeinfo,0), plVar3 == (long *)0x0)
       ) {
      iVar2 = 1;
    }
    else {
      iVar2 = (**(code **)(*plVar3 + 0x270))(plVar3);
    }
  }
  else {
    iVar2 = (**(code **)(*plVar3 + 0x270))(plVar3);
  }
  return iVar2;
}

Assistant:

virtual int nmeshes()
    {
        if (fLeftElSide) {
            TPZMultiphysicsElement *mfcel = dynamic_cast<TPZMultiphysicsElement *>(fLeftElSide.Element());
            if(mfcel)
            {
                return mfcel->NMeshes();
            }
        }
        if (fRightElSide) {
            TPZMultiphysicsElement *mfcel = dynamic_cast<TPZMultiphysicsElement *>(fRightElSide.Element()); 
            if (mfcel) {
                return mfcel->NMeshes();
            }
        }
        return 1;
    }